

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

void __thiscall
Fossilize::VulkanDevice::physical_device_feature_query
          (VulkanDevice *this,VkPhysicalDeviceFeatures2 *pdf2)

{
  VkPhysicalDeviceFeatures2 *pdf2_local;
  VulkanDevice *this_local;
  
  if ((this->is_null_device & 1U) == 0) {
    if (vkGetPhysicalDeviceFeatures2 == (PFN_vkGetPhysicalDeviceFeatures2)0x0) {
      if (vkGetPhysicalDeviceFeatures != (PFN_vkGetPhysicalDeviceFeatures)0x0) {
        (*vkGetPhysicalDeviceFeatures)(this->gpu,&pdf2->features);
      }
    }
    else {
      (*vkGetPhysicalDeviceFeatures2)(this->gpu,pdf2);
    }
  }
  return;
}

Assistant:

void VulkanDevice::physical_device_feature_query(VkPhysicalDeviceFeatures2 *pdf2)
{
	if (is_null_device)
		return;

	if (vkGetPhysicalDeviceFeatures2)
		vkGetPhysicalDeviceFeatures2(gpu, pdf2);
	else if (vkGetPhysicalDeviceFeatures)
		vkGetPhysicalDeviceFeatures(gpu, &pdf2->features);
}